

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block_test.cc
# Opt level: O3

void __thiscall
leveldb::FilterBlockTest_MultiChunk_Test::TestBody(FilterBlockTest_MultiChunk_Test *this)

{
  TestHashFilter *policy;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  int iVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  FilterBlockReader reader;
  Slice block;
  FilterBlockBuilder builder;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_138;
  AssertionResult local_130;
  AssertHelper local_120;
  string local_118;
  FilterBlockReader local_f8;
  Slice local_d0;
  FilterBlockBuilder local_c0;
  
  policy = &(this->super_FilterBlockTest).policy_;
  FilterBlockBuilder::FilterBlockBuilder(&local_c0,&policy->super_FilterPolicy);
  FilterBlockBuilder::StartBlock(&local_c0,0);
  local_f8.policy_ = (FilterPolicy *)0x131105;
  local_f8.data_ = (char *)0x3;
  FilterBlockBuilder::AddKey(&local_c0,(Slice *)&local_f8);
  FilterBlockBuilder::StartBlock(&local_c0,2000);
  local_f8.policy_ = (FilterPolicy *)0x13115f;
  local_f8.data_ = (char *)0x3;
  FilterBlockBuilder::AddKey(&local_c0,(Slice *)&local_f8);
  FilterBlockBuilder::StartBlock(&local_c0,0xc1c);
  local_f8.policy_ = (FilterPolicy *)0x131163;
  local_f8.data_ = (char *)0x3;
  FilterBlockBuilder::AddKey(&local_c0,(Slice *)&local_f8);
  FilterBlockBuilder::StartBlock(&local_c0,9000);
  local_f8.policy_ = (FilterPolicy *)0x131163;
  local_f8.data_ = (char *)0x3;
  FilterBlockBuilder::AddKey(&local_c0,(Slice *)&local_f8);
  local_f8.policy_ = (FilterPolicy *)0x131167;
  local_f8.data_ = (char *)0x5;
  FilterBlockBuilder::AddKey(&local_c0,(Slice *)&local_f8);
  local_d0 = FilterBlockBuilder::Finish(&local_c0);
  FilterBlockReader::FilterBlockReader(&local_f8,&policy->super_FilterPolicy,&local_d0);
  local_118._M_dataplus._M_p = "foo";
  local_118._M_string_length = 3;
  local_130.success_ = FilterBlockReader::KeyMayMatch(&local_f8,0,(Slice *)&local_118);
  local_130.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (local_130.success_) {
    local_118._M_dataplus._M_p = "bar";
    local_118._M_string_length = 3;
    local_130.success_ = FilterBlockReader::KeyMayMatch(&local_f8,2000,(Slice *)&local_118);
    local_130.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (local_130.success_) {
      local_118._M_dataplus._M_p = "box";
      local_118._M_string_length = 3;
      local_130.success_ = FilterBlockReader::KeyMayMatch(&local_f8,0,(Slice *)&local_118);
      local_130.success_ = !local_130.success_;
      local_130.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (local_130.success_) {
        local_118._M_dataplus._M_p = "hello";
        local_118._M_string_length = 5;
        local_130.success_ = FilterBlockReader::KeyMayMatch(&local_f8,0,(Slice *)&local_118);
        local_130.success_ = !local_130.success_;
        local_130.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (local_130.success_) {
          local_118._M_dataplus._M_p = "box";
          local_118._M_string_length = 3;
          local_130.success_ = FilterBlockReader::KeyMayMatch(&local_f8,0xc1c,(Slice *)&local_118);
          local_130.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (local_130.success_) {
            local_118._M_dataplus._M_p = "foo";
            local_118._M_string_length = 3;
            local_130.success_ = FilterBlockReader::KeyMayMatch(&local_f8,0xc1c,(Slice *)&local_118)
            ;
            local_130.success_ = !local_130.success_;
            local_130.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (local_130.success_) {
              testing::AssertionResult::~AssertionResult(&local_130);
              local_118._M_dataplus._M_p = "bar";
              local_118._M_string_length = 3;
              local_130.success_ =
                   FilterBlockReader::KeyMayMatch(&local_f8,0xc1c,(Slice *)&local_118);
              local_130.success_ = !local_130.success_;
              local_130.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!local_130.success_) {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_118,(internal *)&local_130,
                           (AssertionResult *)"!reader.KeyMayMatch(3100, \"bar\")","false","true",
                           in_R9);
                iVar2 = 0x6a;
                goto LAB_001089db;
              }
              testing::AssertionResult::~AssertionResult(&local_130);
              local_118._M_dataplus._M_p = "hello";
              local_118._M_string_length = 5;
              local_130.success_ =
                   FilterBlockReader::KeyMayMatch(&local_f8,0xc1c,(Slice *)&local_118);
              local_130.success_ = !local_130.success_;
              local_130.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!local_130.success_) {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_118,(internal *)&local_130,
                           (AssertionResult *)"!reader.KeyMayMatch(3100, \"hello\")","false","true",
                           in_R9);
                iVar2 = 0x6b;
                goto LAB_001089db;
              }
              testing::AssertionResult::~AssertionResult(&local_130);
              local_118._M_dataplus._M_p = "foo";
              local_118._M_string_length = 3;
              local_130.success_ =
                   FilterBlockReader::KeyMayMatch(&local_f8,0x1004,(Slice *)&local_118);
              local_130.success_ = !local_130.success_;
              local_130.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!local_130.success_) {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_118,(internal *)&local_130,
                           (AssertionResult *)"!reader.KeyMayMatch(4100, \"foo\")","false","true",
                           in_R9);
                iVar2 = 0x6e;
                goto LAB_001089db;
              }
              testing::AssertionResult::~AssertionResult(&local_130);
              local_118._M_dataplus._M_p = "bar";
              local_118._M_string_length = 3;
              local_130.success_ =
                   FilterBlockReader::KeyMayMatch(&local_f8,0x1004,(Slice *)&local_118);
              local_130.success_ = !local_130.success_;
              local_130.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!local_130.success_) {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_118,(internal *)&local_130,
                           (AssertionResult *)"!reader.KeyMayMatch(4100, \"bar\")","false","true",
                           in_R9);
                iVar2 = 0x6f;
                goto LAB_001089db;
              }
              testing::AssertionResult::~AssertionResult(&local_130);
              local_118._M_dataplus._M_p = "box";
              local_118._M_string_length = 3;
              local_130.success_ =
                   FilterBlockReader::KeyMayMatch(&local_f8,0x1004,(Slice *)&local_118);
              local_130.success_ = !local_130.success_;
              local_130.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!local_130.success_) {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_118,(internal *)&local_130,
                           (AssertionResult *)"!reader.KeyMayMatch(4100, \"box\")","false","true",
                           in_R9);
                iVar2 = 0x70;
                goto LAB_001089db;
              }
              testing::AssertionResult::~AssertionResult(&local_130);
              local_118._M_dataplus._M_p = "hello";
              local_118._M_string_length = 5;
              local_130.success_ =
                   FilterBlockReader::KeyMayMatch(&local_f8,0x1004,(Slice *)&local_118);
              local_130.success_ = !local_130.success_;
              local_130.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!local_130.success_) {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_118,(internal *)&local_130,
                           (AssertionResult *)"!reader.KeyMayMatch(4100, \"hello\")","false","true",
                           in_R9);
                iVar2 = 0x71;
                goto LAB_001089db;
              }
              testing::AssertionResult::~AssertionResult(&local_130);
              local_118._M_dataplus._M_p = "box";
              local_118._M_string_length = 3;
              local_130.success_ =
                   FilterBlockReader::KeyMayMatch(&local_f8,9000,(Slice *)&local_118);
              local_130.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!local_130.success_) {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_118,(internal *)&local_130,
                           (AssertionResult *)"reader.KeyMayMatch(9000, \"box\")","false","true",
                           in_R9);
                iVar2 = 0x74;
                goto LAB_001089db;
              }
              testing::AssertionResult::~AssertionResult(&local_130);
              local_118._M_dataplus._M_p = "hello";
              local_118._M_string_length = 5;
              local_130.success_ =
                   FilterBlockReader::KeyMayMatch(&local_f8,9000,(Slice *)&local_118);
              local_130.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!local_130.success_) {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_118,(internal *)&local_130,
                           (AssertionResult *)"reader.KeyMayMatch(9000, \"hello\")","false","true",
                           in_R9);
                iVar2 = 0x75;
                goto LAB_001089db;
              }
              testing::AssertionResult::~AssertionResult(&local_130);
              local_118._M_dataplus._M_p = "foo";
              local_118._M_string_length = 3;
              local_130.success_ =
                   FilterBlockReader::KeyMayMatch(&local_f8,9000,(Slice *)&local_118);
              local_130.success_ = !local_130.success_;
              local_130.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!local_130.success_) {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_118,(internal *)&local_130,
                           (AssertionResult *)"!reader.KeyMayMatch(9000, \"foo\")","false","true",
                           in_R9);
                iVar2 = 0x76;
                goto LAB_001089db;
              }
              testing::AssertionResult::~AssertionResult(&local_130);
              local_118._M_dataplus._M_p = "bar";
              local_118._M_string_length = 3;
              local_130.success_ =
                   FilterBlockReader::KeyMayMatch(&local_f8,9000,(Slice *)&local_118);
              local_130.success_ = !local_130.success_;
              local_130.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (!local_130.success_) {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_118,(internal *)&local_130,
                           (AssertionResult *)"!reader.KeyMayMatch(9000, \"bar\")","false","true",
                           in_R9);
                iVar2 = 0x77;
                goto LAB_001089db;
              }
            }
            else {
              testing::Message::Message((Message *)&local_138);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_118,(internal *)&local_130,
                         (AssertionResult *)"!reader.KeyMayMatch(3100, \"foo\")","false","true",
                         in_R9);
              iVar2 = 0x69;
LAB_001089db:
              testing::internal::AssertHelper::AssertHelper
                        (&local_120,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/filter_block_test.cc"
                         ,iVar2,local_118._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_138);
              testing::internal::AssertHelper::~AssertHelper(&local_120);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p);
              }
              if (local_138._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_138._M_head_impl + 8))();
              }
            }
            testing::AssertionResult::~AssertionResult(&local_130);
            goto LAB_001082e0;
          }
          testing::Message::Message((Message *)&local_138);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_118,(internal *)&local_130,
                     (AssertionResult *)"reader.KeyMayMatch(3100, \"box\")","false","true",in_R9);
          iVar2 = 0x68;
        }
        else {
          testing::Message::Message((Message *)&local_138);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_118,(internal *)&local_130,
                     (AssertionResult *)"!reader.KeyMayMatch(0, \"hello\")","false","true",in_R9);
          iVar2 = 0x65;
        }
      }
      else {
        testing::Message::Message((Message *)&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_118,(internal *)&local_130,
                   (AssertionResult *)"!reader.KeyMayMatch(0, \"box\")","false","true",in_R9);
        iVar2 = 100;
      }
    }
    else {
      testing::Message::Message((Message *)&local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_118,(internal *)&local_130,
                 (AssertionResult *)"reader.KeyMayMatch(2000, \"bar\")","false","true",in_R9);
      iVar2 = 99;
    }
  }
  else {
    testing::Message::Message((Message *)&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&local_130,(AssertionResult *)"reader.KeyMayMatch(0, \"foo\")"
               ,"false","true",in_R9);
    iVar2 = 0x62;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_120,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/filter_block_test.cc"
             ,iVar2,local_118._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_138);
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_138._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_138._M_head_impl + 8))();
  }
  uVar1._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_130.message_;
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_130.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)
            local_130.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)local_130.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x10)) {
      operator_delete(*(undefined8 **)
                       local_130.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    }
    operator_delete((void *)uVar1._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
LAB_001082e0:
  if (local_c0.filter_offsets_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.filter_offsets_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c0.tmp_keys_.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.tmp_keys_.
                    super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.result_._M_dataplus._M_p != &local_c0.result_.field_2) {
    operator_delete(local_c0.result_._M_dataplus._M_p);
  }
  if (local_c0.start_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.start_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.keys_._M_dataplus._M_p != &local_c0.keys_.field_2) {
    operator_delete(local_c0.keys_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(FilterBlockTest, MultiChunk) {
  FilterBlockBuilder builder(&policy_);

  // First filter
  builder.StartBlock(0);
  builder.AddKey("foo");
  builder.StartBlock(2000);
  builder.AddKey("bar");

  // Second filter
  builder.StartBlock(3100);
  builder.AddKey("box");

  // Third filter is empty

  // Last filter
  builder.StartBlock(9000);
  builder.AddKey("box");
  builder.AddKey("hello");

  Slice block = builder.Finish();
  FilterBlockReader reader(&policy_, block);

  // Check first filter
  ASSERT_TRUE(reader.KeyMayMatch(0, "foo"));
  ASSERT_TRUE(reader.KeyMayMatch(2000, "bar"));
  ASSERT_TRUE(!reader.KeyMayMatch(0, "box"));
  ASSERT_TRUE(!reader.KeyMayMatch(0, "hello"));

  // Check second filter
  ASSERT_TRUE(reader.KeyMayMatch(3100, "box"));
  ASSERT_TRUE(!reader.KeyMayMatch(3100, "foo"));
  ASSERT_TRUE(!reader.KeyMayMatch(3100, "bar"));
  ASSERT_TRUE(!reader.KeyMayMatch(3100, "hello"));

  // Check third filter (empty)
  ASSERT_TRUE(!reader.KeyMayMatch(4100, "foo"));
  ASSERT_TRUE(!reader.KeyMayMatch(4100, "bar"));
  ASSERT_TRUE(!reader.KeyMayMatch(4100, "box"));
  ASSERT_TRUE(!reader.KeyMayMatch(4100, "hello"));

  // Check last filter
  ASSERT_TRUE(reader.KeyMayMatch(9000, "box"));
  ASSERT_TRUE(reader.KeyMayMatch(9000, "hello"));
  ASSERT_TRUE(!reader.KeyMayMatch(9000, "foo"));
  ASSERT_TRUE(!reader.KeyMayMatch(9000, "bar"));
}